

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::PlasticMaterial::readFrom(PlasticMaterial *this,BinaryReader *binary)

{
  BinaryReader *in_RSI;
  vec3f *in_RDI;
  
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<bool,void>(in_RSI,(bool *)in_RDI);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  BinaryReader::read<pbrt::Texture>((BinaryReader *)this,(shared_ptr<pbrt::Texture> *)binary);
  return;
}

Assistant:

void PlasticMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(map_kd);
    binary.read(map_ks);
    binary.read(kd);
    binary.read(ks);
    binary.read(roughness);
    binary.read(remapRoughness);
    binary.read(map_roughness);
    binary.read(map_bump);
  }